

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_pagegrain_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  env->CP0_PageGrain =
       (uint)arg1 & env->CP0_PageGrain_rw_bitmask |
       env->CP0_PageGrain & (env->CP0_PageGrain_rw_bitmask ^ 0xffffffffU);
  compute_hflags(env);
  restore_pamask(env);
  return;
}

Assistant:

void helper_mtc0_pagegrain(CPUMIPSState *env, target_ulong arg1)
{
    /* SmartMIPS not implemented */
    /* 1k pages not implemented */
    env->CP0_PageGrain = (arg1 & env->CP0_PageGrain_rw_bitmask) |
                         (env->CP0_PageGrain & ~env->CP0_PageGrain_rw_bitmask);
    compute_hflags(env);
    restore_pamask(env);
}